

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_service_client(t_lua_generator *this,ostream *out,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  t_service *ptVar4;
  ostream *poVar5;
  undefined4 extraout_var_00;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  string *psVar7;
  t_type *ptVar8;
  t_struct *ptVar9;
  t_const_value *ptVar10;
  reference pptVar11;
  char *pcVar12;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_320
  ;
  t_field **local_318;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_310
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xf;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  t_type *local_160;
  t_type *type;
  string argname;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_128
  ;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  string local_f8 [8];
  string funcname;
  string local_d0;
  undefined1 local_b0 [8];
  string sig;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_88;
  t_function **local_80;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_78;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *extends_s;
  string classname;
  t_service *tservice_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  classname.field_2._8_8_ = tservice;
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extends_s,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2),"Client");
  ptVar4 = t_service::get_extends((t_service *)classname.field_2._8_8_);
  poVar5 = std::operator<<(out,(string *)&extends_s);
  std::operator<<(poVar5," = __TObject.new(");
  if (ptVar4 == (t_service *)0x0) {
    std::operator<<(out,"__TClient");
  }
  else {
    iVar2 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(out,(string *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar5,"Client");
  }
  poVar5 = std::operator<<(out,", {");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"  __type = \'");
  poVar5 = std::operator<<(poVar5,(string *)&extends_s);
  poVar5 = std::operator<<(poVar5,"\'");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"})");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  __x = t_service::get_functions((t_service *)classname.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_78);
  local_88._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_80,&local_88);
  local_78._M_current = local_80;
  while( true ) {
    sig.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&sig.field_2 + 8));
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    tfunction = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,"",(allocator *)(funcname.field_2._M_local_buf + 0xf));
    function_signature((string *)local_b0,this,tfunction,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(funcname.field_2._M_local_buf + 0xf));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string(local_f8,(string *)psVar7);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"function ");
    poVar5 = std::operator<<(poVar5,(string *)&extends_s);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::operator<<(poVar5,(string *)local_b0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"self:send_");
    poVar5 = std::operator<<(poVar5,(string *)local_b0);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&args,(t_generator *)this);
    std::operator<<(poVar5,(string *)&args);
    std::__cxx11::string::~string((string *)&args);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_78);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        std::operator<<(out,"return ");
      }
      poVar5 = std::operator<<(out,"self:recv_");
      poVar5 = std::operator<<(poVar5,(string *)local_b0);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_down((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"end");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"function ");
    poVar5 = std::operator<<(poVar5,(string *)&extends_s);
    poVar5 = std::operator<<(poVar5,":send_");
    poVar5 = std::operator<<(poVar5,(string *)local_b0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"self.oprot:writeMessageBegin(\'");
    poVar5 = std::operator<<(poVar5,local_f8);
    poVar5 = std::operator<<(poVar5,"\', ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    bVar1 = t_function::is_oneway(*pptVar6);
    pcVar12 = "TMessageType.CALL";
    if (bVar1) {
      pcVar12 = "TMessageType.ONEWAY";
    }
    poVar5 = std::operator<<(poVar5,pcVar12);
    poVar5 = std::operator<<(poVar5,", self._seqid)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"local args = ");
    poVar5 = std::operator<<(poVar5,local_f8);
    poVar5 = std::operator<<(poVar5,"_args:new{}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    ptVar9 = t_function::get_arglist(*pptVar6);
    fld_iter._M_current = (t_field **)t_struct::get_members(ptVar9);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_128);
    local_128._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(fld_iter._M_current);
    while( true ) {
      argname.field_2._8_8_ =
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)fld_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_128,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&argname.field_2 + 8));
      if (!bVar1) break;
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_128);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar11);
      std::__cxx11::string::string((string *)&type,(string *)psVar7);
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_128);
      ptVar10 = t_field::get_value(*pptVar11);
      if (ptVar10 == (t_const_value *)0x0) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"args.");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_128);
        ptVar8 = t_field::get_type(*pptVar11);
        local_160 = t_generator::get_true_type(ptVar8);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"if ");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        poVar5 = std::operator<<(poVar5," ~= nil then");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"args.");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"else");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"args.");
        poVar5 = std::operator<<(poVar5,(string *)&type);
        poVar5 = std::operator<<(poVar5," = ");
        ptVar8 = local_160;
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_128);
        ptVar10 = t_field::get_value(*pptVar11);
        render_const_value_abi_cxx11_(&local_180,this,ptVar8,ptVar10);
        poVar5 = std::operator<<(poVar5,(string *)&local_180);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_180);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"end");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&type);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_128);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"args:write(self.oprot)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"self.oprot:writeMessageEnd()");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"self.oprot.trans:flush()");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"end");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_78);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"function ");
      poVar5 = std::operator<<(poVar5,(string *)&extends_s);
      poVar5 = std::operator<<(poVar5,":recv_");
      poVar5 = std::operator<<(poVar5,(string *)local_b0);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_1a0);
      poVar5 = std::operator<<(poVar5,"local fname, mtype, rseqid = self.iprot:");
      poVar5 = std::operator<<(poVar5,"readMessageBegin()");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
      poVar5 = std::operator<<(poVar5,"if mtype == TMessageType.EXCEPTION then");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_1e0);
      poVar5 = std::operator<<(poVar5,"  local x = TApplicationException:new{}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_200);
      poVar5 = std::operator<<(poVar5,"  x:read(self.iprot)");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_220);
      poVar5 = std::operator<<(poVar5,"  self.iprot:readMessageEnd()");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_240);
      poVar5 = std::operator<<(poVar5,"  error(x)");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_260);
      poVar5 = std::operator<<(poVar5,"end");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_280);
      poVar5 = std::operator<<(poVar5,"local result = ");
      poVar5 = std::operator<<(poVar5,local_f8);
      poVar5 = std::operator<<(poVar5,"_result:new{}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_2a0);
      poVar5 = std::operator<<(poVar5,"result:read(self.iprot)");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_2c0);
      poVar5 = std::operator<<(poVar5,"self.iprot:readMessageEnd()");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_78);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_2e0);
        poVar5 = std::operator<<(poVar5,"if result.success ~= nil then");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)&xf,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&xf);
        poVar5 = std::operator<<(poVar5,"  return result.success");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&xf);
        std::__cxx11::string::~string((string *)&local_2e0);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_78);
        ptVar9 = t_function::get_xceptions(*pptVar6);
        x_iter._M_current = (t_field **)t_struct::get_members(ptVar9);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator(&local_310);
        local_318 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
        local_310._M_current = local_318;
        while( true ) {
          local_320._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_310,&local_320);
          if (!bVar1) break;
          t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
          poVar5 = std::operator<<(out,(string *)&local_340);
          poVar5 = std::operator<<(poVar5,"elseif result.");
          pptVar11 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_310);
          psVar7 = t_field::get_name_abi_cxx11_(*pptVar11);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          poVar5 = std::operator<<(poVar5," then");
          poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
          poVar5 = std::operator<<(poVar5,(string *)&local_360);
          poVar5 = std::operator<<(poVar5,"  error(result.");
          pptVar11 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_310);
          psVar7 = t_field::get_name_abi_cxx11_(*pptVar11);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          poVar5 = std::operator<<(poVar5,")");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_340);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_310);
        }
        t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_380);
        poVar5 = std::operator<<(poVar5,"end");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_3a0);
        poVar5 = std::operator<<(poVar5,"error(TApplicationException:new{errorCode = ");
        poVar5 = std::operator<<(poVar5,"TApplicationException.MISSING_RESULT})");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_380);
      }
      t_generator::indent_down((t_generator *)this);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"end");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)local_b0);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_78);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string((string *)&extends_s);
  return;
}

Assistant:

void t_lua_generator::generate_service_client(ostream& out, t_service* tservice) {
  string classname = tservice->get_name() + "Client";
  t_service* extends_s = tservice->get_extends();

  // Client object definition
  out << classname << " = __TObject.new(";
  if (extends_s != nullptr) {
    out << extends_s->get_name() << "Client";
  } else {
    out << "__TClient";
  }
  out << ", {" << endl << "  __type = '" << classname << "'" << endl << "})" << endl;

  // Send/Recv functions
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string sig = function_signature(*f_iter);
    string funcname = (*f_iter)->get_name();

    // Wrapper function
    indent(out) << endl << "function " << classname << ":" << sig << endl;
    indent_up();

    indent(out) << "self:send_" << sig << endl << indent();
    if (!(*f_iter)->is_oneway()) {
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << "return ";
      }
      out << "self:recv_" << sig << endl;
    }

    indent_down();
    indent(out) << "end" << endl;

    // Send function
    indent(out) << endl << "function " << classname << ":send_" << sig << endl;
    indent_up();

    indent(out) << "self.oprot:writeMessageBegin('" << funcname << "', "
                << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
                << ", self._seqid)" << endl;
    indent(out) << "local args = " << funcname << "_args:new{}" << endl;

    // Set the args
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    for (fld_iter = args.begin(); fld_iter != args.end(); ++fld_iter) {
      std::string argname = (*fld_iter)->get_name();
      if ((*fld_iter)->get_value() != nullptr) {
        // Insert default value for nil arguments
        t_type* type = get_true_type((*fld_iter)->get_type());
        indent(out) << "if " << argname << " ~= nil then" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << argname << endl;
        indent_down();
        indent(out) << "else" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << render_const_value(type, (*fld_iter)->get_value()) << endl;
        indent_down();
        indent(out) << "end" << endl;
      } else {
        indent(out) << "args." << argname << " = " << argname << endl;
      }
    }

    indent(out) << "args:write(self.oprot)" << endl;
    indent(out) << "self.oprot:writeMessageEnd()" << endl;
    indent(out) << "self.oprot.trans:flush()" << endl;

    indent_down();
    indent(out) << "end" << endl;

    // Recv function
    if (!(*f_iter)->is_oneway()) {
      indent(out) << endl << "function " << classname << ":recv_" << sig << endl;
      indent_up();

      out << indent() << "local fname, mtype, rseqid = self.iprot:"
          << "readMessageBegin()" << endl << indent() << "if mtype == TMessageType.EXCEPTION then"
          << endl << indent() << "  local x = TApplicationException:new{}" << endl << indent()
          << "  x:read(self.iprot)" << endl << indent() << "  self.iprot:readMessageEnd()" << endl
          << indent() << "  error(x)" << endl << indent() << "end" << endl << indent()
          << "local result = " << funcname << "_result:new{}" << endl << indent()
          << "result:read(self.iprot)" << endl << indent() << "self.iprot:readMessageEnd()" << endl;

      // Return the result if it's not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << indent() << "if result.success ~= nil then" << endl << indent() << "  return result.success"
            << endl;

        // Throw custom exceptions
        const std::vector<t_field*>& xf = (*f_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator x_iter;
        for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
          out << indent() << "elseif result." << (*x_iter)->get_name() << " then" << endl
              << indent() << "  error(result." << (*x_iter)->get_name() << ")" << endl;
        }

        out << indent() << "end" << endl << indent()
            << "error(TApplicationException:new{errorCode = "
            << "TApplicationException.MISSING_RESULT})" << endl;
      }

      indent_down();
      indent(out) << "end" << endl;
    }
  }
}